

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O0

VOID CorUnix::InternalEndCurrentThread(CPalThread *pThread)

{
  IPalObject *pIVar1;
  long *local_20;
  ISynchStateController *pSynchStateController;
  CPalThread *pCStack_10;
  PAL_ERROR palError;
  CPalThread *pThread_local;
  
  pSynchStateController._4_4_ = 0;
  local_20 = (long *)0x0;
  pCStack_10 = pThread;
  pSynchStateController._4_4_ =
       (**(code **)(*g_pSynchronizationManager + 8))(g_pSynchronizationManager,pThread,pThread);
  if ((pSynchStateController._4_4_ != 0) && ((PAL_InitializeChakraCoreCalled & 1U) == 0)) {
    abort();
  }
  CThreadSuspensionInfo::AcquireSuspensionLock(&pCStack_10->suspensionInfo,pCStack_10);
  CThreadSynchronizationInfo::SetThreadState(&pCStack_10->synchronizationInfo,TS_DONE);
  CThreadSuspensionInfo::ReleaseSuspensionLock(&pCStack_10->suspensionInfo,pCStack_10);
  pIVar1 = CPalThread::GetThreadObject(pCStack_10);
  pSynchStateController._4_4_ = (*pIVar1->_vptr_IPalObject[5])(pIVar1,pCStack_10,&local_20);
  if (pSynchStateController._4_4_ == 0) {
    pSynchStateController._4_4_ = (**(code **)(*local_20 + 8))(local_20,1);
    if (pSynchStateController._4_4_ != 0) {
      fprintf(_stderr,"] %s %s:%d","InternalEndCurrentThread",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
              ,0x35e);
      fprintf(_stderr,"Unable to mark thread object as signaled");
    }
    (**(code **)(*local_20 + 0x30))();
  }
  else {
    fprintf(_stderr,"] %s %s:%d","InternalEndCurrentThread",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
            ,0x365);
    fprintf(_stderr,"Unable to obtain state controller for thread");
  }
  CPalThread::AddThreadReference(pCStack_10);
  pIVar1 = CPalThread::GetThreadObject(pCStack_10);
  (*pIVar1->_vptr_IPalObject[8])(pIVar1,pCStack_10);
  PROCRemoveThread(pCStack_10,pCStack_10);
  CPalThread::ReleaseThreadReference(pCStack_10);
  return;
}

Assistant:

VOID
CorUnix::InternalEndCurrentThread(
    CPalThread *pThread
    )
{
    PAL_ERROR palError = NO_ERROR;
    ISynchStateController *pSynchStateController = NULL;

#ifdef PAL_PERF
    PERFDisableThreadProfile(UserCreatedThread != pThread->GetThreadType());
#endif

    //
    // Abandon any objects owned by this thread
    //

    palError = g_pSynchronizationManager->AbandonObjectsOwnedByThread(
        pThread,
        pThread
        );

    if (NO_ERROR != palError)
    {
        ERROR("Failure abandoning owned objects");
    }

    //
    // Need to synchronize setting the thread state to TS_DONE since
    // this is checked for in InternalSuspendThreadFromData.
    // TODO: Is this still needed after removing InternalSuspendThreadFromData?
    //

    pThread->suspensionInfo.AcquireSuspensionLock(pThread);
    pThread->synchronizationInfo.SetThreadState(TS_DONE);
    pThread->suspensionInfo.ReleaseSuspensionLock(pThread);

    //
    // Mark the thread object as signaled
    //

    palError = pThread->GetThreadObject()->GetSynchStateController(
        pThread,
        &pSynchStateController
        );

    if (NO_ERROR == palError)
    {
        palError = pSynchStateController->SetSignalCount(1);
        if (NO_ERROR != palError)
        {
            ASSERT("Unable to mark thread object as signaled");
        }

        pSynchStateController->ReleaseController();
    }
    else
    {
        ASSERT("Unable to obtain state controller for thread");
    }

    //
    // Add a reference to the thread data before releasing the
    // thread object, so we can still use it
    //

    pThread->AddThreadReference();

    //
    // Release the reference to the IPalObject for this thread
    //

    pThread->GetThreadObject()->ReleaseReference(pThread);

    /* Remove thread for the thread list of the process
        (don't do if this is the last thread -> gets handled by
        TerminateProcess->PROCCleanupProcess->PROCTerminateOtherThreads) */

    PROCRemoveThread(pThread, pThread);

    //
    // Now release our reference to the thread data. We cannot touch
    // it after this point
    //

    pThread->ReleaseThreadReference();
}